

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall
Board::draw_board(Board *this,set<Point,_std::less<Point>,_std::allocator<Point>_> *possible_moves,
                 map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>
                 *possible_plays,Point *chosen,uint turn)

{
  uchar uVar1;
  dimension y;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> *p_Var2;
  bool bVar3;
  char cVar4;
  short sVar5;
  const_iterator cVar6;
  iterator iVar7;
  ulong uVar8;
  dimension x;
  int iVar9;
  uchar background;
  Point local_a8;
  Point local_a4;
  ulong local_a0;
  int local_94;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> *local_90;
  _Base_ptr local_88;
  string local_80;
  set<Point,_std::less<Point>,_std::allocator<Point>_> threatened;
  
  local_90 = &possible_moves->_M_t;
  std::operator<<((ostream *)&std::cout,"  ");
  for (sVar5 = -8; sVar5 != 0; sVar5 = sVar5 + 1) {
    print_char_index((char)sVar5 + 'I');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  p_Var2 = local_90;
  get_threatened(&threatened,this,(set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_90,
                 possible_plays,chosen,turn);
  local_88 = &(((_Rep_type *)&p_Var2->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  uVar8 = 7;
  while (-1 < (int)uVar8) {
    sVar5 = (short)uVar8 + 1;
    local_94 = (int)sVar5;
    local_a0 = uVar8;
    print_index(sVar5);
    y = (dimension)local_a0;
    for (iVar9 = 0; iVar9 != 8; iVar9 = iVar9 + 1) {
      x = (dimension)iVar9;
      Point::Point((Point *)&local_80,x,y);
      bVar3 = Point::operator==((Point *)&local_80,chosen);
      background = 0xdc;
      if (!bVar3) {
        Point::Point((Point *)&local_80,x,y);
        cVar6 = std::
                _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                ::find(local_90,(key_type *)&local_80);
        if (cVar6._M_node == local_88) {
          background = ((char)local_a0 + (char)iVar9 & 1U) * '\x02' + 0xf3;
        }
        else {
          Point::Point((Point *)&local_80,x,y);
          iVar7 = std::
                  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                  ::find(&threatened._M_t,(key_type *)&local_80);
          if ((_Rb_tree_header *)iVar7._M_node == &threatened._M_t._M_impl.super__Rb_tree_header) {
            background = '\"';
            uVar1 = '\x1c';
          }
          else {
            background = 0xa0;
            uVar1 = '|';
          }
          if (((int)local_a0 + iVar9 & 1U) == 0) {
            background = uVar1;
          }
        }
      }
      Point::Point((Point *)&local_80,x,y);
      if (*(long *)(*(long *)&(this->m_board).m_data.
                              super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [(short)local_80._M_dataplus._M_p].
                              super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                   + (long)local_80._M_dataplus._M_p._2_2_ * 0x10) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"  ",(allocator<char> *)&local_a8);
        print_colorful(&local_80,'\0',background);
      }
      else {
        Point::Point(&local_a8,x,y);
        (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_a8.m_x].
                                           super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                + (long)local_a8.m_y * 0x10) + 0x18))(&local_80);
        Point::Point(&local_a4,x,y);
        cVar4 = (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                                                                                      
                                                  super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_a4.m_x].
                                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                        + (long)local_a4.m_y * 0x10) + 0x20))();
        print_colorful(&local_80,-cVar4,background);
      }
      std::__cxx11::string::~string((string *)&local_80);
    }
    print_index((dimension)local_94);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar8 = (ulong)((int)local_a0 - 1);
  }
  std::operator<<((ostream *)&std::cout,"  ");
  for (sVar5 = -8; sVar5 != 0; sVar5 = sVar5 + 1) {
    print_char_index((char)sVar5 + 'I');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
  ~_Rb_tree(&threatened._M_t);
  return;
}

Assistant:

void Board::draw_board(const set<Point> &possible_moves, const map<Point, play> &possible_plays, const Point &chosen,
                       unsigned int turn) {
    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
    unsigned char background;

#if DISPLAY_THREATENED
    auto threatened = get_threatened(possible_moves, possible_plays, chosen, turn);
#endif // DISPLAY_THREATENED

    for (dimension i = SIZE - 1; i >= 0; i--) {
        print_index(i + 1);
        for (dimension j = 0; j < SIZE; j++) {
            if (Point(j, i) == chosen) {
                background = 220;
#if DISPLAY_HINTS
            } else if ((possible_moves.find({j, i}) == possible_moves.end())) {
#else
                }
#endif // DISPLAY_HINTS
                background = (i + j) % 2 ? colors::light_gray : colors::dark_gray;
#if DISPLAY_HINTS
            } else {
#if DISPLAY_THREATENED
                if (threatened.find({j, i}) != threatened.end()) {
                    background = (i + j) % 2 ? colors::light_red : colors::dark_red;
                } else {
#endif // DISPLAY_THREATENED
                    background = (i + j) % 2 ? colors::light_green : colors::dark_green;
#if DISPLAY_THREATENED
                }
#endif // DISPLAY_THREATENED
            }
#endif // DISPLAY_HINTS

            if (m_board[{j, i}] == nullptr) {
                print_colorful("  ", colors::black, background);
            } else {
                print_colorful(m_board[{j, i}]->get_representation(),
                               (m_board[{j, i}]->get_color()) ? colors::white : colors::black, background);
            }
        }
        print_index(i + 1);
        cout << endl;
    }